

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int get_free_fb(AV1_COMMON *cm)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long in_RDI;
  YV12_BUFFER_CONFIG *ybf;
  int num_frame_bufs;
  int i;
  RefCntBuffer *frame_bufs;
  uint local_14;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x62f0) + 0x40);
  lock_buffer_pool((BufferPool *)0x2336ff);
  uVar2 = (uint)*(byte *)(*(long *)(in_RDI + 0x62f0) + 0x48);
  local_14 = 0;
  while (((int)local_14 < (int)uVar2 && (*(int *)(lVar1 + (long)(int)local_14 * 0x58e0) != 0))) {
    local_14 = local_14 + 1;
  }
  if (local_14 == uVar2) {
    local_14 = 0xffffffff;
  }
  else {
    if (*(int *)(lVar1 + (long)(int)local_14 * 0x58e0 + 0x520) != 0) {
      lVar3 = lVar1 + (long)(int)local_14 * 0x58e0;
      *(undefined8 *)(lVar3 + 0x508) = *(undefined8 *)(lVar3 + 0x528);
      *(undefined8 *)(lVar3 + 0x510) = *(undefined8 *)(lVar3 + 0x530);
      *(undefined8 *)(lVar3 + 0x518) = *(undefined8 *)(lVar3 + 0x538);
      *(undefined4 *)(lVar3 + 0x520) = 0;
    }
    *(undefined4 *)(lVar1 + (long)(int)local_14 * 0x58e0) = 1;
  }
  unlock_buffer_pool((BufferPool *)0x233810);
  return local_14;
}

Assistant:

static inline int get_free_fb(AV1_COMMON *cm) {
  RefCntBuffer *const frame_bufs = cm->buffer_pool->frame_bufs;
  int i;

  lock_buffer_pool(cm->buffer_pool);
  const int num_frame_bufs = cm->buffer_pool->num_frame_bufs;
  for (i = 0; i < num_frame_bufs; ++i)
    if (frame_bufs[i].ref_count == 0) break;

  if (i != num_frame_bufs) {
    if (frame_bufs[i].buf.use_external_reference_buffers) {
      // If this frame buffer's y_buffer, u_buffer, and v_buffer point to the
      // external reference buffers. Restore the buffer pointers to point to the
      // internally allocated memory.
      YV12_BUFFER_CONFIG *ybf = &frame_bufs[i].buf;
      ybf->y_buffer = ybf->store_buf_adr[0];
      ybf->u_buffer = ybf->store_buf_adr[1];
      ybf->v_buffer = ybf->store_buf_adr[2];
      ybf->use_external_reference_buffers = 0;
    }

    frame_bufs[i].ref_count = 1;
  } else {
    // We should never run out of free buffers. If this assertion fails, there
    // is a reference leak.
    assert(0 && "Ran out of free frame buffers. Likely a reference leak.");
    // Reset i to be INVALID_IDX to indicate no free buffer found.
    i = INVALID_IDX;
  }

  unlock_buffer_pool(cm->buffer_pool);
  return i;
}